

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

complex<long_double> *
TPZMatrix<std::complex<long_double>_>::ReturnNearestValue
          (complex<long_double> val,TPZVec<std::complex<long_double>_> *Vec,complex<long_double> tol
          )

{
  bool bVar1;
  complex<long_double> *pcVar2;
  complex<long_double> *pcVar3;
  int64_t iVar4;
  TPZVec<std::complex<long_double>_> *in_RSI;
  complex<long_double> *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar5;
  longdouble in_ST5;
  longdouble lVar6;
  longdouble in_ST6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST7;
  complex<long_double> *in_stack_00000028;
  undefined8 in_stack_00000030;
  int64_t i;
  complex<long_double> diff1;
  complex<long_double> diff0;
  complex<long_double> exps;
  complex<long_double> *in_stack_fffffffffffffdc8;
  undefined2 in_stack_fffffffffffffdd0;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffdd2;
  undefined6 uVar10;
  complex<long_double> **local_210;
  complex<long_double> *local_118;
  long local_f0;
  complex<long_double> local_e8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  double local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  complex<long_double> *local_58;
  complex<long_double> *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  double local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  TPZVec<std::complex<long_double>_> *local_8;
  
  local_8 = in_RSI;
  pcVar2 = TPZVec<std::complex<long_double>_>::operator[](in_RSI,0);
  local_48 = *(undefined8 *)pcVar2->_M_value;
  uStack_40 = *(undefined8 *)(pcVar2->_M_value + 8);
  local_38 = *(undefined8 *)(pcVar2->_M_value + 0x10);
  uStack_30 = *(undefined8 *)(pcVar2->_M_value + 0x18);
  std::operator-((complex<long_double> *)
                 CONCAT62(in_stack_fffffffffffffdd2,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
  local_78 = local_18;
  uStack_70 = uStack_10;
  local_88 = local_28;
  uStack_80 = uStack_20;
  fabs(local_28);
  uVar9 = (undefined2)in_stack_00000030;
  uVar10 = (undefined6)((ulong)in_stack_00000030 >> 0x10);
  pcVar2 = in_stack_00000028;
  fabs((double)in_stack_00000028);
  if (in_ST0 < in_ST1) {
    std::complex<long_double>::complex
              ((complex<long_double> *)local_68,(longdouble)1e+10,(longdouble)0);
  }
  else {
    pcVar3 = TPZVec<std::complex<long_double>_>::operator[](local_8,0);
    local_c8 = *(undefined8 *)pcVar3->_M_value;
    local_c0 = *(undefined8 *)(pcVar3->_M_value + 8);
    local_b8 = *(undefined8 *)(pcVar3->_M_value + 0x10);
    local_b0 = *(undefined8 *)(pcVar3->_M_value + 0x18);
    std::operator-((complex<long_double> *)CONCAT62(uVar10,uVar9),pcVar2);
  }
  lVar6 = (longdouble)0;
  pcVar2 = SUB108(lVar6,0);
  uVar9 = (undefined2)((unkuint10)lVar6 >> 0x40);
  lVar5 = in_ST7;
  lVar7 = in_ST7;
  std::complex<long_double>::complex(&local_e8,lVar6,lVar6);
  pcVar3 = TPZVec<std::complex<long_double>_>::operator[](local_8,0);
  *(undefined8 *)in_RDI->_M_value = *(undefined8 *)pcVar3->_M_value;
  *(undefined8 *)(in_RDI->_M_value + 8) = *(undefined8 *)(pcVar3->_M_value + 8);
  *(undefined8 *)(in_RDI->_M_value + 0x10) = *(undefined8 *)(pcVar3->_M_value + 0x10);
  *(undefined8 *)(in_RDI->_M_value + 0x18) = *(undefined8 *)(pcVar3->_M_value + 0x18);
  local_f0 = 1;
  do {
    iVar4 = TPZVec<std::complex<long_double>_>::NElements(local_8);
    if (iVar4 <= local_f0) {
      return in_RDI;
    }
    TPZVec<std::complex<long_double>_>::operator[](local_8,local_f0);
    std::operator-((complex<long_double> *)CONCAT62(uVar10,uVar9),pcVar2);
    local_e8._M_value._0_8_ = local_118;
    fabs((double)local_118);
    uVar9 = (undefined2)in_stack_00000030;
    uVar10 = (undefined6)((ulong)in_stack_00000030 >> 0x10);
    pcVar2 = in_stack_00000028;
    fabs((double)in_stack_00000028);
    bVar1 = in_ST2 < in_ST3;
    in_ST2 = in_ST4;
    in_ST3 = in_ST5;
    lVar6 = lVar7;
    if (bVar1) {
LAB_012c3351:
      local_210 = (complex<long_double> **)local_68;
      lVar8 = lVar6;
      lVar7 = lVar6;
    }
    else {
      in_ST2 = in_ST6;
      in_ST3 = in_ST7;
      in_ST6 = lVar5;
      in_ST7 = lVar7;
      lVar5 = lVar7;
      fabs((double)local_e8._M_value._0_8_);
      uVar9 = (undefined2)local_68._8_8_;
      uVar10 = SUB86(local_68._8_8_,2);
      pcVar2 = (complex<long_double> *)local_68._0_8_;
      fabs((double)local_68._0_8_);
      lVar6 = lVar5;
      if (in_ST5 <= in_ST4) goto LAB_012c3351;
      lVar8 = lVar5;
      lVar7 = lVar5;
      pcVar3 = TPZVec<std::complex<long_double>_>::operator[](local_8,local_f0);
      *(undefined8 *)in_RDI->_M_value = *(undefined8 *)pcVar3->_M_value;
      *(undefined8 *)(in_RDI->_M_value + 8) = *(undefined8 *)(pcVar3->_M_value + 8);
      *(undefined8 *)(in_RDI->_M_value + 0x10) = *(undefined8 *)(pcVar3->_M_value + 0x10);
      *(undefined8 *)(in_RDI->_M_value + 0x18) = *(undefined8 *)(pcVar3->_M_value + 0x18);
      local_210 = (complex<long_double> **)&local_e8;
    }
    local_68._0_8_ = *local_210;
    local_68._8_8_ = local_210[1];
    local_58 = local_210[2];
    pcStack_50 = local_210[3];
    local_f0 = local_f0 + 1;
    in_ST4 = in_ST6;
    in_ST5 = in_ST7;
    in_ST6 = lVar5;
    in_ST7 = lVar6;
    lVar5 = lVar8;
  } while( true );
}

Assistant:

TVar TPZMatrix<TVar>::ReturnNearestValue(TVar val, TPZVec<TVar>& Vec, TVar tol)
{
    TVar exps = val - (TVar)Vec[0];
    TVar diff0 = fabs(exps) >= fabs(tol) ?  (val - (TVar)Vec[0]) : (TVar)1.E10;
    TVar diff1, res = (TVar)Vec[0];
    for(int64_t i = 1; i < Vec.NElements(); i++)
    {
        diff1 = val - (TVar)Vec[i];
        diff0 = ( fabs(diff1) >= fabs(tol) && fabs(diff1) < fabs(diff0) ) ? res = Vec[i],diff1 : diff0;
    }
    return res;
}